

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O3

ssize_t __thiscall Directory::read(Directory *this,int __fd,void *__buf,size_t __nbytes)

{
  char *__name;
  usize minCapacity;
  usize *puVar1;
  uchar uVar2;
  bool bVar3;
  int iVar4;
  char *__pattern;
  int *piVar5;
  dirent *pdVar6;
  size_t sVar7;
  char *__file;
  ssize_t sVar8;
  void *extraout_RAX;
  undefined4 in_register_00000034;
  long lVar9;
  String path;
  stat buff;
  String local_e8;
  stat local_c0;
  
  if (this->dp == (void *)0x0) {
    piVar5 = __errno_location();
    *piVar5 = 0x16;
  }
  else {
    __pattern = String::operator_cast_to_char_(&this->pattern);
    piVar5 = __errno_location();
    *piVar5 = 0;
    pdVar6 = readdir((DIR *)this->dp);
    if (pdVar6 != (dirent *)0x0) {
      do {
        __name = pdVar6->d_name;
        if ((*__pattern == '\0') || (iVar4 = fnmatch(__pattern,__name,0), iVar4 == 0)) {
          uVar2 = pdVar6->d_type;
          *(bool *)__buf = uVar2 == '\x04';
          if ((this->dirsOnly != true) || (uVar2 == '\x04')) {
            if (uVar2 != '\x04') {
              if ((uVar2 != '\n') && (uVar2 != '\0')) goto LAB_0010b3d2;
              String::String(&local_e8,&this->dirpath);
              if (((this->dirpath).data)->len != 0) {
                minCapacity = (local_e8.data)->len + 1;
                String::detach(&local_e8,(local_e8.data)->len,minCapacity);
                (local_e8.data)->str[(local_e8.data)->len] = '/';
                (local_e8.data)->len = minCapacity;
                (local_e8.data)->str[minCapacity] = '\0';
              }
              sVar7 = strlen(__name);
              String::append(&local_e8,__name,sVar7);
              __file = String::operator_cast_to_char_(&local_e8);
              iVar4 = stat(__file,&local_c0);
              if ((iVar4 == 0) && ((local_c0.st_mode & 0xf000) == 0x4000)) {
                *(undefined1 *)__buf = 1;
LAB_0010b31f:
                lVar9 = 0;
                bVar3 = true;
              }
              else {
                if (this->dirsOnly == false) goto LAB_0010b31f;
                lVar9 = 3;
                bVar3 = false;
              }
              if ((local_e8.data)->ref != 0) {
                LOCK();
                puVar1 = &(local_e8.data)->ref;
                *puVar1 = *puVar1 - 1;
                UNLOCK();
                if ((*puVar1 == 0) && (local_e8.data != (Data *)0x0)) {
                  operator_delete__(local_e8.data);
                }
              }
              if (!bVar3) {
                sVar8 = (*(code *)((long)&DAT_0010d420 + (long)(int)(&DAT_0010d420)[lVar9]))();
                return sVar8;
              }
              if ((*__buf & 1) == 0) goto LAB_0010b3d2;
            }
            if ((*__name != '.') ||
               ((pdVar6->d_name[1] != '\0' &&
                ((pdVar6->d_name[1] != '.' || (pdVar6->d_name[2] != '\0')))))) {
LAB_0010b3d2:
              sVar7 = strlen(__name);
              String::String((String *)&local_c0,__name,sVar7);
              String::operator=((String *)CONCAT44(in_register_00000034,__fd),(String *)&local_c0);
              if (*(long *)(local_c0.st_dev + 0x18) != 0) {
                LOCK();
                lVar9 = local_c0.st_dev + 0x18;
                *(long *)lVar9 = *(long *)lVar9 + -1;
                UNLOCK();
                if ((*(long *)lVar9 == 0) && ((void *)local_c0.st_dev != (void *)0x0)) {
                  operator_delete__((void *)local_c0.st_dev);
                  local_c0.st_dev = (__dev_t)extraout_RAX;
                }
              }
              return CONCAT71((int7)(local_c0.st_dev >> 8),1);
            }
          }
        }
        pdVar6 = readdir((DIR *)this->dp);
      } while (pdVar6 != (dirent *)0x0);
    }
  }
  return 0;
}

Assistant:

bool Directory::read(String& name, bool& isDir)
{
#ifdef _WIN32
  if(!findFile)
  {
    SetLastError(ERROR_INVALID_HANDLE);
    return false;
  }
  for(;;)
  {
    if(bufferedEntry)
      bufferedEntry = false;
    else if(!FindNextFile((HANDLE)findFile, (LPWIN32_FIND_DATA)ffd))
    {
      DWORD lastError = GetLastError();
      FindClose((HANDLE)findFile);
      findFile = INVALID_HANDLE_VALUE;
      SetLastError(lastError);
      return false;
    }
    isDir = (((LPWIN32_FIND_DATA)ffd)->dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY) == FILE_ATTRIBUTE_DIRECTORY;
    if(dirsOnly && !isDir)
      continue;
    const char* str = ((LPWIN32_FIND_DATA)ffd)->cFileName;
    if(isDir && *str == '.' && (str[1] == '\0' || (str[1] == '.' && str[2] == '\0')))
      continue;

    if(!pattern.isEmpty())
    {
      struct PatternMatcher
      {
        static bool szWildMatch7(const char* pat, const char* str) {
            const char* s, * p;
            bool star = false;

        loopStart:
            for (s = str, p = pat; *s; ++s, ++p) {
              switch (*p) {
                  case '?':
                    break;
                  case '*':
                    star = true;
                    str = s, pat = p;
                    do { ++pat; } while (*pat == '*');
                    if (!*pat) return true;
                    goto loopStart;
                  default:
                    if (String::toLowerCase(*s) != String::toLowerCase(*p)) goto starCheck;
                    break;
              }
            }
            while (*p == '*') ++p;
            return !*p;
   
        starCheck:
            if (!star) return false;
            str++;
            goto loopStart;
        }
      };

      if(!PatternMatcher::szWildMatch7(pattern, str))
        continue;
    }

    name = String(str, (uint)strlen(str));
    return true;
  }
#else
  if(!dp)
  {
    errno = EINVAL;
    return false;
  }

  const char* pattern = this->pattern;
  errno = 0;
  for(;;)
  {
    struct dirent* dent = readdir((DIR*)dp);
    if(!dent)
      break;
    const char* const str = dent->d_name;
    if(!*pattern || fnmatch(pattern, str, 0) == 0)
    {
      isDir = dent->d_type == DT_DIR;
      if(dirsOnly && !isDir)
        continue;
      if(!isDir && (dent->d_type == DT_LNK || dent->d_type == DT_UNKNOWN))
      {
        String path = dirpath;
        if(!dirpath.isEmpty())
          path.append('/');
        path.append(str, strlen(str));
        struct stat buff;
        if(stat(path, &buff) == 0 && S_ISDIR(buff.st_mode))
          isDir = true;
        else if(dirsOnly)
          continue;
      }
      if(isDir && *str == '.' && (str[1] == '\0' || (str[1] == '.' && str[2] == '\0')))
        continue;
      name = String(str, strlen(str));
      return true;
    }
  }
  return false;
#endif
}